

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

bool __thiscall Rml::DataParser::Parse(DataParser *this,bool is_assignment_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pvVar4;
  pointer pvVar5;
  byte bVar6;
  char cVar7;
  bool bVar8;
  pointer pIVar9;
  pointer this_00;
  String variable_name;
  size_type __dnew;
  String local_70;
  String local_50;
  size_type local_30;
  
  pIVar2 = (this->program).
           super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = (this->program).
           super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pIVar9 = pIVar2;
  if (pIVar3 != pIVar2) {
    do {
      Variant::~Variant(&pIVar9->data);
      pIVar9 = pIVar9 + 1;
    } while (pIVar9 != pIVar3);
    (this->program).super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
    _M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  pvVar4 = (this->variable_addresses).
           super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->variable_addresses).
           super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pvVar4;
  if (pvVar5 != pvVar4) {
    do {
      ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::~vector(this_00)
      ;
      this_00 = this_00 + 1;
    } while (this_00 != pvVar5);
    (this->variable_addresses).
    super__Vector_base<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_std::allocator<std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  }
  this->index = 0;
  this->reached_end = false;
  this->parse_error = false;
  if ((this->expression)._M_string_length == 0) {
    this->reached_end = true;
  }
  SkipWhitespace(this);
  if (is_assignment_expression) {
    paVar1 = &local_70.field_2;
    bVar8 = true;
    do {
      if ((this->reached_end == false) &&
         (((bool *)this->index)[(long)(this->expression)._M_dataplus._M_p] != false)) {
        Rml::Parse::VariableOrFunctionName_abi_cxx11_
                  (&local_70,(Parse *)this,(DataParser *)0x0,(bool *)this->index);
        if ((char *)local_70._M_string_length == (char *)0x0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          local_30 = 0x39;
          local_50._M_dataplus._M_p =
               (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
          local_50.field_2._M_allocated_capacity = local_30;
          builtin_strncpy(local_50._M_dataplus._M_p,
                          "Expected a variable for assignment but got an empty name.",0x39);
          local_50._M_string_length = local_30;
          local_50._M_dataplus._M_p[local_30] = '\0';
          Error(this,&local_50);
LAB_001f4d78:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,
                            (ulong)(local_70.field_2._M_allocated_capacity + 1));
          }
          break;
        }
        SkipWhitespace(this);
        if (this->reached_end == false) {
          bVar6 = (this->expression)._M_dataplus._M_p[this->index];
        }
        else {
          bVar6 = 0;
        }
        if (bVar6 < 0x3b) {
          if ((bVar6 != 0) && (bVar6 != 0x28)) {
LAB_001f4daf:
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            local_30 = 0x1f;
            local_50._M_dataplus._M_p =
                 (pointer)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_30);
            local_50.field_2._M_allocated_capacity = local_30;
            builtin_strncpy(local_50._M_dataplus._M_p,"one of  = ; (  or end of string",0x1f);
            local_50._M_string_length = local_30;
            local_50._M_dataplus._M_p[local_30] = '\0';
            Expected(this,&local_50);
            goto LAB_001f4d78;
          }
LAB_001f4b79:
          Rml::Parse::Function(this,EventFnc,&local_70,false);
        }
        else {
          if (bVar6 == 0x3b) goto LAB_001f4b79;
          if (bVar6 != 0x3d) goto LAB_001f4daf;
          Match(this,'=',true);
          Rml::Parse::Expression(this);
          VariableGetSet(this,&local_70,true);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          (ulong)(local_70.field_2._M_allocated_capacity + 1));
        }
      }
      if (this->reached_end == false) {
        cVar7 = (this->expression)._M_dataplus._M_p[this->index];
      }
      else {
        cVar7 = '\0';
      }
      if (cVar7 == '\0') {
        bVar8 = false;
      }
      else if (cVar7 == ';') {
        Match(this,';',true);
      }
      else {
        local_50._M_dataplus._M_p = (char *)0x14;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        local_70._M_dataplus._M_p =
             (pointer)::std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_50);
        local_70.field_2._M_allocated_capacity = (size_type)local_50._M_dataplus._M_p;
        builtin_strncpy(local_70._M_dataplus._M_p,"\';\' or end of string",0x14);
        local_70._M_string_length = (size_type)local_50._M_dataplus._M_p;
        local_70._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
        Expected(this,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          (ulong)(local_70.field_2._M_allocated_capacity + 1));
        }
        bVar8 = false;
      }
    } while (bVar8);
  }
  else {
    Rml::Parse::Expression(this);
  }
  if (this->reached_end == false) {
    this->parse_error = true;
    CreateString_abi_cxx11_
              (&local_70,"Unexpected character \'%c\' encountered.",
               (ulong)(uint)(int)(this->expression)._M_dataplus._M_p[this->index]);
    Error(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  if ((this->parse_error == false) && (this->program_stack_size != 0)) {
    this->parse_error = true;
    CreateString_abi_cxx11_
              (&local_70,
               "Internal parser error, inconsistent stack operations. Stack size is %d at parse end."
              );
    Error(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  return (bool)(this->parse_error ^ 1);
}

Assistant:

bool Parse(bool is_assignment_expression)
	{
		program.clear();
		variable_addresses.clear();
		index = 0;
		reached_end = false;
		parse_error = false;
		if (expression.empty())
			reached_end = true;

		SkipWhitespace();

		if (is_assignment_expression)
			Parse::Assignment(*this);
		else
			Parse::Expression(*this);

		if (!reached_end)
		{
			parse_error = true;
			Error(CreateString("Unexpected character '%c' encountered.", Look()));
		}
		if (!parse_error && program_stack_size != 0)
		{
			parse_error = true;
			Error(CreateString("Internal parser error, inconsistent stack operations. Stack size is %d at parse end.", program_stack_size));
		}

		return !parse_error;
	}